

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaderparser.cpp
# Opt level: O1

bool ShaderParserParseTextures
               (string *base_path,string *prev_line,string *line,uint32_t current_char,
               uint32_t line_number,FErrorReport *report_error,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *watches,vector<Texture,_std::allocator<Texture>_> *textures)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  ulong uVar4;
  long *plVar5;
  undefined8 uVar6;
  int iVar7;
  ulong uVar8;
  size_type *psVar9;
  ulong uVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *unaff_R13;
  bool bVar11;
  string full_path;
  Texture texture;
  string path;
  string uniform_type;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  uniform_tokens;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  uint32_t local_ec;
  value_type local_e8;
  undefined1 local_c8 [24];
  string local_b0 [8];
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  GLuint local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  string *local_68 [2];
  undefined1 local_58 [40];
  
  std::__cxx11::string::substr((ulong)&local_88,(ulong)prev_line);
  if (local_88._M_string_length == 0) {
    iVar7 = -1;
    iVar3 = -1;
  }
  else {
    uVar4 = 0xffffffff;
    uVar10 = 0;
    uVar8 = 0xffffffff;
    do {
      if (local_88._M_dataplus._M_p[uVar10] == '(') {
        uVar4 = uVar10 & 0xffffffff;
      }
      iVar3 = (int)uVar4;
      if (local_88._M_dataplus._M_p[uVar10] == ')') {
        uVar8 = uVar10 & 0xffffffff;
      }
      iVar7 = (int)uVar8;
      uVar10 = uVar10 + 1;
    } while (local_88._M_string_length != uVar10);
  }
  if (iVar7 <= iVar3) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                   "Path format should be @path(path): ",&local_88);
    local_68[0] = (string *)CONCAT44(local_68[0]._4_4_,line_number);
    if ((report_error->super__Function_base)._M_manager != (_Manager_type)0x0) {
      (*report_error->_M_invoker)
                ((_Any_data *)report_error,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                 (uint *)local_68);
      if ((undefined1 *)local_c8._0_8_ != local_c8 + 0x10) {
        operator_delete((void *)local_c8._0_8_,(ulong)(local_c8._16_8_ + 1));
      }
      bVar11 = false;
      goto LAB_00123c7f;
    }
    std::__throw_bad_function_call();
LAB_00123cba:
    std::__throw_bad_function_call();
LAB_00123cbf:
    uVar6 = std::__throw_bad_function_call();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if (local_b0 != (string  [8])unaff_R13) {
      operator_delete((void *)local_b0,
                      CONCAT71(local_a0._M_allocated_capacity._1_7_,local_a0._M_local_buf[0]) + 1);
    }
    if (local_68[0] != line) {
      operator_delete(local_68[0],(ulong)(local_58._0_8_ + 1));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_58 + 0x10));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    _Unwind_Resume(uVar6);
  }
  std::__cxx11::string::substr((ulong)local_c8,(ulong)&local_88);
  std::__cxx11::string::operator=((string *)&local_88,(string *)local_c8);
  pcVar2 = local_c8 + 0x10;
  if ((pointer)local_c8._0_8_ != pcVar2) {
    operator_delete((void *)local_c8._0_8_,(ulong)(local_c8._16_8_ + 1));
  }
  SplitString((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_58 + 0x10),line,' ');
  if (local_58._24_8_ - local_58._16_8_ == 0x60) {
    line = (string *)local_58;
    local_68[0] = line;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_68,*(long *)(local_58._16_8_ + 0x20),
               *(long *)(local_58._16_8_ + 0x28) + *(long *)(local_58._16_8_ + 0x20));
    iVar3 = std::__cxx11::string::compare((char *)local_68);
    if (iVar3 == 0) {
      stbi__vertically_flip_on_load_global = 1;
      unaff_R13 = &local_a0;
      local_c8._16_8_ = 0;
      local_a8 = 0;
      local_a0._M_local_buf[0] = '\0';
      local_90 = 0;
      paVar1 = &local_110.field_2;
      pcVar2 = (base_path->_M_dataplus)._M_p;
      local_110._M_dataplus._M_p = (pointer)paVar1;
      local_b0 = (string  [8])unaff_R13;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_110,pcVar2,pcVar2 + base_path->_M_string_length);
      std::__cxx11::string::_M_replace_aux((ulong)&local_110,local_110._M_string_length,0,'\x01');
      plVar5 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_110,(ulong)local_88._M_dataplus._M_p);
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      psVar9 = (size_type *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_e8.field_2._M_allocated_capacity = *psVar9;
        local_e8.field_2._8_8_ = plVar5[3];
      }
      else {
        local_e8.field_2._M_allocated_capacity = *psVar9;
        local_e8._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_e8._M_string_length = plVar5[1];
      *plVar5 = (long)psVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != paVar1) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      local_c8._16_8_ =
           stbi_load(local_e8._M_dataplus._M_p,(int *)local_c8,(int *)(local_c8 + 4),
                     (int *)(local_c8 + 8),4);
      bVar11 = (stbi_uc *)local_c8._16_8_ != (stbi_uc *)0x0;
      if ((stbi_uc *)local_c8._16_8_ == (stbi_uc *)0x0) {
        std::operator+(&local_110,"Failed to load texture at path ",&local_88);
        local_ec = line_number;
        if ((report_error->super__Function_base)._M_manager == (_Manager_type)0x0)
        goto LAB_00123cbf;
        (*report_error->_M_invoker)((_Any_data *)report_error,&local_110,&local_ec);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != paVar1) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        std::__cxx11::string::substr((ulong)&local_110,local_58._16_8_ + 0x40);
        std::__cxx11::string::operator=(local_b0,(string *)&local_110);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p != paVar1) {
          operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
        }
        std::vector<Texture,_std::allocator<Texture>_>::push_back(textures,(value_type *)local_c8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(watches,&local_e8);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      if (local_b0 != (string  [8])unaff_R13) {
        operator_delete((void *)local_b0,
                        CONCAT71(local_a0._M_allocated_capacity._1_7_,local_a0._M_local_buf[0]) + 1)
        ;
      }
    }
    else {
      local_c8._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_c8,"@path syntax is only supported on sampler2D uniform types","");
      local_e8._M_dataplus._M_p._0_4_ = line_number;
      if ((report_error->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00123cba;
      (*report_error->_M_invoker)
                ((_Any_data *)report_error,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c8,
                 (uint *)&local_e8);
      if ((pointer)local_c8._0_8_ != pcVar2) {
        operator_delete((void *)local_c8._0_8_,(ulong)(local_c8._16_8_ + 1));
      }
      bVar11 = false;
    }
    if (local_68[0] != line) {
      operator_delete(local_68[0],(ulong)(local_58._0_8_ + 1));
    }
  }
  else {
    bVar11 = false;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_58 + 0x10));
LAB_00123c7f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return bVar11;
}

Assistant:

bool ShaderParserParseTextures(const std::string& base_path, const std::string& prev_line, const std::string& line, uint32_t current_char, uint32_t line_number, FErrorReport report_error, std::vector<std::string>& watches, std::vector<Texture>& textures) {
    int last_parenthesis_index = -1;
    int first_parenthesis_index = -1;

    std::string path = prev_line.substr(current_char + 5, std::string::npos);

    for (int i = 0; i < path.size(); ++i) {
        if (path[i] == '(') first_parenthesis_index = i;
        if (path[i] == ')') last_parenthesis_index = i;
    }

    if (last_parenthesis_index <= first_parenthesis_index) {
        report_error("Path format should be @path(path): " + path, line_number);
        return false;
    }

    path = path.substr(first_parenthesis_index + 1, last_parenthesis_index - 1);

    std::vector<std::string> uniform_tokens = SplitString(line,  ' ');
    if (uniform_tokens.size() != 3) {
        return false;
    }

    std::string uniform_type = uniform_tokens[1];
    if (uniform_type != "sampler2D") {
        report_error("@path syntax is only supported on sampler2D uniform types", line_number);
        return false;
    }

    stbi_set_flip_vertically_on_load(true);

    Texture texture;
    std::string full_path = base_path + PATH_DELIMITER + path;
    texture.Data = stbi_load(full_path.c_str(), &texture.Width, &texture.Height, &texture.Channels, 4);

    if (!texture.Data) {
        report_error("Failed to load texture at path " + path, line_number);
        return false;
    }
    texture.Binding = uniform_tokens[2].substr(0, uniform_tokens[2].length() - 1);

    textures.push_back(texture);
    watches.push_back(full_path);

    return true;
}